

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDress2.c
# Opt level: O3

Vec_Int_t * Abc_ObjDressClass(Vec_Ptr_t *vRes,Vec_Int_t *vClass2Num,int Class)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  undefined8 *puVar4;
  void *pvVar5;
  void **ppvVar6;
  
  if (Class < 1) {
    __assert_fail("Class > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDress2.c"
                  ,0xb9,"Vec_Int_t *Abc_ObjDressClass(Vec_Ptr_t *, Vec_Int_t *, int)");
  }
  if (Class < vClass2Num->nSize) {
    uVar1 = vClass2Num->pArray[(uint)Class];
    if ((ulong)uVar1 == 0) {
      __assert_fail("ClassNumber != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDress2.c"
                    ,0xbb,"Vec_Int_t *Abc_ObjDressClass(Vec_Ptr_t *, Vec_Int_t *, int)");
    }
    uVar2 = vRes->nSize;
    if ((int)uVar1 < 1) {
      vClass2Num->pArray[(uint)Class] = uVar2;
      puVar4 = (undefined8 *)malloc(0x10);
      *puVar4 = 0x10;
      pvVar5 = malloc(0x40);
      puVar4[1] = pvVar5;
      if (uVar2 == vRes->nCap) {
        if ((int)uVar2 < 0x10) {
          if (vRes->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc(0x80);
          }
          else {
            ppvVar6 = (void **)realloc(vRes->pArray,0x80);
          }
          vRes->pArray = ppvVar6;
          vRes->nCap = 0x10;
        }
        else {
          if (vRes->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc((ulong)uVar2 << 4);
          }
          else {
            ppvVar6 = (void **)realloc(vRes->pArray,(ulong)uVar2 << 4);
          }
          vRes->pArray = ppvVar6;
          vRes->nCap = uVar2 * 2;
        }
      }
      else {
        ppvVar6 = vRes->pArray;
      }
      iVar3 = vRes->nSize;
      vRes->nSize = iVar3 + 1U;
      ppvVar6[iVar3] = puVar4;
      if ((long)iVar3 < 0) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                      ,0x1b7,"void *Vec_PtrEntryLast(Vec_Ptr_t *)");
      }
      ppvVar6 = vRes->pArray + ((ulong)(iVar3 + 1U) - 1);
    }
    else {
      if ((int)uVar2 <= (int)uVar1) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      ppvVar6 = vRes->pArray + uVar1;
    }
    return (Vec_Int_t *)*ppvVar6;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

Vec_Int_t * Abc_ObjDressClass( Vec_Ptr_t * vRes, Vec_Int_t * vClass2Num, int Class )
{
    int ClassNumber;
    assert( Class > 0 );
    ClassNumber = Vec_IntEntry( vClass2Num, Class );
    assert( ClassNumber != 0 );
    if ( ClassNumber > 0 )
        return (Vec_Int_t *)Vec_PtrEntry( vRes, ClassNumber ); // previous class
    // create new class
    Vec_IntWriteEntry( vClass2Num, Class, Vec_PtrSize(vRes) );
    Vec_PtrPush( vRes, Vec_IntAlloc(4) );
    return (Vec_Int_t *)Vec_PtrEntryLast( vRes ); 
}